

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_constr.cc
# Opt level: O3

void __thiscall
mp::LinTerms::
unfold_from<gch::small_vector<std::pair<int,double>,256u,std::allocator<std::pair<int,double>>>>
          (LinTerms *this,
          small_vector<std::pair<int,_double>,_256U,_std::allocator<std::pair<int,_double>_>_> *vec)

{
  size_ty request;
  size_ty sVar1;
  ptr ppVar2;
  long lVar3;
  int local_3c;
  double local_38;
  
  (this->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
  (this->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
  request = (vec->super_small_vector_base<std::allocator<std::pair<int,_double>_>,_256U>).m_data.
            super_small_vector_data_base<std::pair<int,_double>_*,_unsigned_long>.m_size;
  gch::detail::small_vector_base<std::allocator<double>,_6U>::request_capacity
            ((small_vector_base<std::allocator<double>,_6U> *)this,request);
  gch::detail::small_vector_base<std::allocator<int>,_6U>::request_capacity
            (&(this->vars_).super_small_vector_base<std::allocator<int>,_6U>,request);
  sVar1 = (vec->super_small_vector_base<std::allocator<std::pair<int,_double>_>,_256U>).m_data.
          super_small_vector_data_base<std::pair<int,_double>_*,_unsigned_long>.m_size;
  if (sVar1 != 0) {
    ppVar2 = (vec->super_small_vector_base<std::allocator<std::pair<int,_double>_>,_256U>).m_data.
             super_small_vector_data_base<std::pair<int,_double>_*,_unsigned_long>.m_data_ptr;
    lVar3 = 0;
    do {
      local_38 = *(double *)((long)&ppVar2->second + lVar3);
      local_3c = *(int *)((long)&ppVar2->first + lVar3);
      gch::detail::small_vector_base<std::allocator<double>,6u>::append_element<double_const&>
                ((small_vector_base<std::allocator<double>,6u> *)this,&local_38);
      gch::detail::small_vector_base<std::allocator<int>,6u>::append_element<int_const&>
                ((small_vector_base<std::allocator<int>,6u> *)&this->vars_,&local_3c);
      lVar3 = lVar3 + 0x10;
    } while (sVar1 << 4 != lVar3);
  }
  return;
}

Assistant:

void LinTerms::unfold_from(const Vec& vec) {
  clear();
  reserve(vec.size());
  for (const auto& v: vec)
    add_term(v.second, v.first);
}